

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

VoidPromiseAndPipeline * __thiscall
capnp::QueuedClient::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,QueuedClient *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  uint *puVar1;
  EventLoop *pEVar2;
  PromiseNode *pPVar3;
  Event **ppEVar4;
  CallContextHook *pCVar5;
  QueuedPipeline *this_00;
  QueuedPipeline *ptrCopy;
  Refcounted *refcounted;
  Own<kj::_::TransformPromiseNode<kj::Own<capnp::PipelineHook>,_kj::Own<CallResultHolder>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:342:9),_kj::_::PropagateException>_>
  OVar6;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:349:9),_kj::Own<CallResultHolder>_>
  PVar7;
  ForkedPromise<kj::Own<CallResultHolder>_> callResultPromise;
  undefined1 local_88 [8];
  EventLoop *pEStack_80;
  Own<kj::_::PromiseNode> local_78;
  undefined1 local_68 [8];
  Event **local_60;
  Promise<kj::Own<CallResultHolder>_> local_58;
  Own<kj::_::PromiseNode> local_48;
  ForkBranchBase *local_38;
  CallContextHook *pCStack_30;
  
  kj::_::ForkHub<kj::Own<capnp::ClientHook>_>::addBranch
            ((ForkHub<kj::Own<capnp::ClientHook>_> *)local_68);
  local_48.ptr._0_4_ = CONCAT22(local_48.ptr._2_2_,methodId);
  local_38 = (ForkBranchBase *)context->disposer;
  pCStack_30 = context->ptr;
  context->ptr = (CallContextHook *)0x0;
  local_48.disposer = (Disposer *)interfaceId;
  kj::
  heap<kj::_::TransformPromiseNode<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>,kj::Own<capnp::ClientHook>,kj::CaptureByMove<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>&&)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::CaptureByMove<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>&&)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>
            (&local_78,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:334:9),_kj::Own<capnp::CallContextHook>_>
              *)local_68,(PropagateException *)&local_48);
  local_88 = (undefined1  [8])CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_);
  pEStack_80 = (EventLoop *)local_78.ptr;
  kj::Promise<kj::Own<CallResultHolder>_>::fork(&local_58);
  pEVar2 = pEStack_80;
  if (pEStack_80 != (EventLoop *)0x0) {
    pEStack_80 = (EventLoop *)0x0;
    (**(code **)*(_func_int **)local_88)
              (local_88,(_func_int *)((long)pEVar2->port[-2]._vptr_EventPort + (long)&pEVar2->port))
    ;
  }
  pCVar5 = pCStack_30;
  if (pCStack_30 != (CallContextHook *)0x0) {
    pCStack_30 = (CallContextHook *)0x0;
    (**(local_38->super_PromiseNode)._vptr_PromiseNode)
              (local_38,pCVar5->_vptr_CallContextHook[-2] + (long)&pCVar5->_vptr_CallContextHook);
  }
  ppEVar4 = local_60;
  if (local_60 != (Event **)0x0) {
    local_60 = (Event **)0x0;
    (**(code **)*(_func_int **)local_68)(local_68,(long)ppEVar4 + (long)(*ppEVar4)[-1].prev);
  }
  kj::_::ForkHub<kj::Own<CallResultHolder>_>::addBranch
            ((ForkHub<kj::Own<CallResultHolder>_> *)local_88);
  OVar6 = kj::
          heap<kj::_::TransformPromiseNode<kj::Own<capnp::PipelineHook>,kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>,capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>&&)_1_,kj::_::PropagateException>
                    (&local_48,(anon_class_1_0_00000001_for_func *)local_88,
                     (PropagateException *)local_68);
  pEVar2 = pEStack_80;
  local_78.disposer._0_4_ = local_48.disposer._0_4_;
  local_78.disposer._4_4_ = local_48.disposer._4_4_;
  local_78.ptr = (PromiseNode *)CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_);
  if (pEStack_80 != (EventLoop *)0x0) {
    pEStack_80 = (EventLoop *)0x0;
    (**(code **)*(_func_int **)local_88)
              (local_88,(_func_int *)((long)pEVar2->port[-2]._vptr_EventPort + (long)&pEVar2->port),
               OVar6.ptr);
  }
  this_00 = (QueuedPipeline *)operator_new(0x48);
  QueuedPipeline::QueuedPipeline(this_00,(Promise<kj::Own<capnp::PipelineHook>_> *)&local_78);
  puVar1 = &(this_00->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  kj::_::ForkHub<kj::Own<CallResultHolder>_>::addBranch
            ((ForkHub<kj::Own<CallResultHolder>_> *)local_88);
  PVar7 = kj::
          Promise<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
          ::
          then<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>&&)_2_,kj::_::PropagateException>
                    ((Promise<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
                      *)&local_48,(anon_class_1_0_00000001_for_func *)local_88,
                     (PropagateException *)local_68);
  pEVar2 = pEStack_80;
  if (pEStack_80 != (EventLoop *)0x0) {
    pEStack_80 = (EventLoop *)0x0;
    (**(code **)*(_func_int **)local_88)
              (local_88,(_func_int *)((long)pEVar2->port[-2]._vptr_EventPort + (long)&pEVar2->port),
               PVar7.super_PromiseBase.node.ptr);
  }
  pPVar3 = local_78.ptr;
  *(undefined4 *)&(__return_storage_ptr__->promise).super_PromiseBase.node.disposer =
       local_48.disposer._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->promise).super_PromiseBase.node.disposer + 4) =
       local_48.disposer._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->promise).super_PromiseBase.node.ptr = local_48.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->promise).super_PromiseBase.node.ptr + 4) =
       local_48.ptr._4_4_;
  (__return_storage_ptr__->pipeline).disposer = &(this_00->super_Refcounted).super_Disposer;
  (__return_storage_ptr__->pipeline).ptr = (PipelineHook *)this_00;
  if ((EventLoop *)local_78.ptr != (EventLoop *)0x0) {
    local_78.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_),
               (_func_int *)
               ((long)((EventPort *)pPVar3->_vptr_PromiseNode)[-2]._vptr_EventPort +
               (long)&pPVar3->_vptr_PromiseNode));
  }
  pPVar3 = local_58.super_PromiseBase.node.ptr;
  if ((EventLoop *)local_58.super_PromiseBase.node.ptr != (EventLoop *)0x0) {
    local_58.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_58.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_58.super_PromiseBase.node.disposer,
               (long)&pPVar3->_vptr_PromiseNode +
               (long)((EventPort *)pPVar3->_vptr_PromiseNode)[-2]._vptr_EventPort);
  }
  return __return_storage_ptr__;
}

Assistant:

VoidPromiseAndPipeline call(uint64_t interfaceId, uint16_t methodId,
                              kj::Own<CallContextHook>&& context) override {
    // This is a bit complicated.  We need to initiate this call later on.  When we initiate the
    // call, we'll get a void promise for its completion and a pipeline object.  Right now, we have
    // to produce a similar void promise and pipeline that will eventually be chained to those.
    // The problem is, these are two independent objects, but they both depend on the result of
    // one future call.
    //
    // So, we need to set up a continuation that will initiate the call later, then we need to
    // fork the promise for that continuation in order to send the completion promise and the
    // pipeline to their respective places.
    //
    // TODO(perf):  Too much reference counting?  Can we do better?  Maybe a way to fork
    //   Promise<Tuple<T, U>> into Tuple<Promise<T>, Promise<U>>?

    struct CallResultHolder: public kj::Refcounted {
      // Essentially acts as a refcounted \VoidPromiseAndPipeline, so that we can create a promise
      // for it and fork that promise.

      VoidPromiseAndPipeline content;
      // One branch of the fork will use content.promise, the other branch will use
      // content.pipeline.  Neither branch will touch the other's piece.

      inline CallResultHolder(VoidPromiseAndPipeline&& content): content(kj::mv(content)) {}

      kj::Own<CallResultHolder> addRef() { return kj::addRef(*this); }
    };

    // Create a promise for the call initiation.
    kj::ForkedPromise<kj::Own<CallResultHolder>> callResultPromise =
        promiseForCallForwarding.addBranch().then(kj::mvCapture(context,
        [=](kj::Own<CallContextHook>&& context, kj::Own<ClientHook>&& client){
          return kj::refcounted<CallResultHolder>(
              client->call(interfaceId, methodId, kj::mv(context)));
        })).fork();

    // Create a promise that extracts the pipeline from the call initiation, and construct our
    // QueuedPipeline to chain to it.
    auto pipelinePromise = callResultPromise.addBranch().then(
        [](kj::Own<CallResultHolder>&& callResult){
          return kj::mv(callResult->content.pipeline);
        });
    auto pipeline = kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise));

    // Create a promise that simply chains to the void promise produced by the call initiation.
    auto completionPromise = callResultPromise.addBranch().then(
        [](kj::Own<CallResultHolder>&& callResult){
          return kj::mv(callResult->content.promise);
        });

    // OK, now we can actually return our thing.
    return VoidPromiseAndPipeline { kj::mv(completionPromise), kj::mv(pipeline) };
  }